

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

DWORD GetFileAttributesW(LPCWSTR lpFileName)

{
  int iVar1;
  DWORD DVar2;
  size_t sVar3;
  char *lpMultiByteStr;
  long in_FS_OFFSET;
  DWORD dwLastError;
  DWORD local_74;
  DWORD dwRet;
  char *filename;
  int length;
  int size;
  CPalThread *pThread;
  LPCWSTR lpFileName_local;
  PathCharString filenamePS;
  
  filenamePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpFileName_local);
  local_74 = 0xffffffff;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (lpFileName == (LPCWSTR)0x0) {
    CorUnix::CPalThread::SetLastError(3);
  }
  else {
    sVar3 = PAL_wcslen(lpFileName);
    iVar1 = ((int)sVar3 + 1) * MaxWCharToAcpLengthFactor;
    lpMultiByteStr =
         StackString<32UL,_char>::OpenStringBuffer
                   ((StackString<32UL,_char> *)&lpFileName_local,(long)iVar1);
    if (lpMultiByteStr == (char *)0x0) {
      CorUnix::CPalThread::SetLastError(8);
    }
    else {
      iVar1 = WideCharToMultiByte(0,0,lpFileName,-1,lpMultiByteStr,iVar1,(LPCSTR)0x0,(LPBOOL)0x0);
      StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&lpFileName_local,(long)iVar1)
      ;
      if (iVar1 == 0) {
        DVar2 = GetLastError();
        if (DVar2 == 0x7a) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CorUnix::CPalThread::SetLastError(0xce);
        }
        else {
          fprintf(_stderr,"] %s %s:%d","GetFileAttributesW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                  ,0x715);
          fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
          CorUnix::CPalThread::SetLastError(0x54f);
        }
      }
      else {
        local_74 = GetFileAttributesA(lpMultiByteStr);
      }
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpFileName_local);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != filenamePS.m_count) {
      __stack_chk_fail();
    }
    return local_74;
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetFileAttributesW(
           IN LPCWSTR lpFileName)
{
    CPalThread *pThread;
    int   size;
    PathCharString filenamePS;
    int length = 0;
    char * filename;
    DWORD dwRet = (DWORD) -1;

    PERF_ENTRY(GetFileAttributesW);
    ENTRY("GetFileAttributesW(lpFileName=%p (%S))\n",
          lpFileName?lpFileName:W16_NULLSTRING,
          lpFileName?lpFileName:W16_NULLSTRING);

    pThread = InternalGetCurrentThread();
    if (lpFileName == NULL) 
    {
        pThread->SetLastError(ERROR_PATH_NOT_FOUND);
        goto done;
    }
    
    length = (PAL_wcslen(lpFileName)+1) * MaxWCharToAcpLengthFactor;
    filename = filenamePS.OpenStringBuffer(length);
    if (NULL == filename)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    size = WideCharToMultiByte( CP_ACP, 0, lpFileName, -1, filename, length,
                                NULL, NULL );
    filenamePS.CloseBuffer(size);
    
    if( size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
    }
    else
        dwRet = GetFileAttributesA( filename );
done:
    LOGEXIT("GetFileAttributesW returns DWORD %#x\n", dwRet);
    PERF_EXIT(GetFileAttributesW);
    return dwRet;
}